

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workqueue.h
# Opt level: O0

int __thiscall
pbrt::WorkQueue<pbrt::MaterialEvalWorkItem<pbrt::DiffuseMaterial>_>::Size
          (WorkQueue<pbrt::MaterialEvalWorkItem<pbrt::DiffuseMaterial>_> *this)

{
  long in_RDI;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return *(int *)(in_RDI + 0x238);
}

Assistant:

PBRT_CPU_GPU
    int Size() const {
#ifdef PBRT_IS_GPU_CODE
#ifdef PBRT_USE_LEGACY_CUDA_ATOMICS
        return size;
#else
        return size.load(cuda::std::memory_order_relaxed);
#endif
#else
        return size.load(std::memory_order_relaxed);
#endif
    }